

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O1

bool vkt::tessellation::anon_unknown_0::TessCoordComponent::compareOneMinusTessCoord
               (TestLog *log,float value)

{
  ostringstream *this;
  undefined1 local_190 [384];
  
  if ((value != 1.0) || (NAN(value))) {
    this = (ostringstream *)(local_190 + 8);
    local_190._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,
               "Failure: comp + (1.0-comp) doesn\'t equal 1.0 for some component of tessellation coordinate"
               ,0x5a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
  }
  return (bool)(-(value == 1.0) & 1);
}

Assistant:

bool compareOneMinusTessCoord (tcu::TestLog& log, const float value)
{
	if (value != 1.0f)
	{
		log << tcu::TestLog::Message << "Failure: comp + (1.0-comp) doesn't equal 1.0 for some component of tessellation coordinate" << tcu::TestLog::EndMessage;
		return false;
	}
	return true;
}